

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

MPP_RET reader_index_read(FileReader reader,RK_S32 index,FileBufSlot **buf)

{
  FileBufSlot *pFVar1;
  
  if ((reader == (FileReader)0x0) || (*(long *)((long)reader + 0x70) == 0)) {
    _mpp_log_l(4,"mpi_dec_utils","invalid reader %p\n","reader_index_read",reader);
  }
  else {
    if (index < *(int *)((long)reader + 100)) {
      while (pFVar1 = *(FileBufSlot **)(*(long *)((long)reader + 0x70) + (long)index * 8),
            pFVar1 == (FileBufSlot *)0x0) {
        usleep(1000);
      }
      *buf = pFVar1;
      return MPP_OK;
    }
    _mpp_log_l(4,"mpi_dec_utils","invalid read index % max %d\n","reader_index_read");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET reader_index_read(FileReader reader, RK_S32 index, FileBufSlot **buf)
{
    FileReaderImpl *impl = (FileReaderImpl*)reader;
    FileBufSlot *slot = NULL;

    if (NULL == impl || NULL == impl->slots) {
        mpp_log_f("invalid reader %p\n", reader);
        return MPP_NOK;
    }

    if (index >= (RK_S32)impl->slot_max) {
        mpp_log_f("invalid read index % max %d\n", index, impl->slot_max);
        return MPP_NOK;
    }

    do {
        slot = impl->slots[index];
        if (slot == NULL)
            msleep(1);
    } while (slot == NULL);

    mpp_assert(slot);

    *buf  = slot;

    return MPP_OK;
}